

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::ReLUParameter::MergePartialFromCodedStream(ReLUParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  void *pvVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  undefined8 in_RAX;
  int64 iVar8;
  UnknownFieldSet *pUVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  undefined8 uStack_38;
  
  this_00 = &this->_internal_metadata_;
  uStack_38 = in_RAX;
LAB_003b0fa8:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b0fcc;
      input->buffer_ = pbVar2 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b0fcc:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar10 = (uint)uVar11;
    if ((uVar11 & 0x100000000) != 0) {
      uVar7 = (uint)(uVar11 >> 3) & 0x1fffffff;
      if (uVar7 == 2) {
        if ((char)uVar11 == '\x10') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar6 = (uint32)bVar1;
            uVar10 = (uint)bVar1;
            if ((char)bVar1 < '\0') goto LAB_003b10b3;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar6 = 0;
LAB_003b10b3:
            iVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
            uVar10 = (uint)iVar8;
            if (iVar8 < 0) {
              return false;
            }
          }
          if (uVar10 < 3) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
            this->engine_ = uVar10;
          }
          else {
            pvVar4 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar4 & 1) == 0) {
              pUVar9 = google::protobuf::internal::
                       InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ::mutable_unknown_fields_slow
                                 (&this_00->
                                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                 );
            }
            else {
              pUVar9 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
            }
            google::protobuf::UnknownFieldSet::AddVarint(pUVar9,2,(long)(int)uVar10);
          }
          goto LAB_003b0fa8;
        }
      }
      else if ((uVar7 == 1) && ((char)uVar11 == '\r')) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pfVar3 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)((long)&uStack_38 + 4));
          if (!bVar5) {
            return false;
          }
          fVar12 = uStack_38._4_4_;
        }
        else {
          fVar12 = *pfVar3;
          input->buffer_ = (uint8 *)(pfVar3 + 1);
        }
        this->negative_slope_ = fVar12;
        goto LAB_003b0fa8;
      }
    }
    if (uVar10 == 0) {
      return true;
    }
    if ((uVar10 & 7) == 4) {
      return true;
    }
    pvVar4 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar9 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar9 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    bVar5 = google::protobuf::internal::WireFormat::SkipField(input,uVar10,pUVar9);
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool ReLUParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ReLUParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional float negative_slope = 1 [default = 0];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {
          set_has_negative_slope();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &negative_slope_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReLUParameter.Engine engine = 2 [default = DEFAULT];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::ReLUParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::ReLUParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(2, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ReLUParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ReLUParameter)
  return false;
#undef DO_
}